

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

bool CharArrayParms(int *capacity,int *offset,int *a,int *Stack,int *sp,bool ranged)

{
  bool ranged_local;
  int *sp_local;
  int *Stack_local;
  int *a_local;
  int *offset_local;
  int *capacity_local;
  
  if (ranged) {
    *capacity = Stack[*sp + -1];
    *offset = Stack[*sp + -2];
    if ((*capacity < 1) || (*offset < 0)) {
      *sp = *sp + -4;
      return false;
    }
    *sp = *sp + -2;
  }
  else {
    *capacity = 0x7fffffff;
    *offset = 0;
  }
  *a = Stack[*sp + -1];
  *offset = Stack[*sp + -2] + *offset;
  *sp = *sp + -2;
  return true;
}

Assistant:

static bool CharArrayParms(int &capacity, int &offset, int &a, int *Stack, int &sp, bool ranged)
{
	if (ranged)
	{
		capacity = STACK(1);
		offset = STACK(2);
		if (capacity < 1 || offset < 0)
		{
			sp -= 4;
			return false;
		}
		sp -= 2;
	}
	else
	{
		capacity = INT_MAX;
		offset = 0;
	}
	a = STACK(1);
	offset += STACK(2);
	sp -= 2;
	return true;
}